

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iec61131.y.hpp
# Opt level: O3

void __thiscall
deci::parser_t::value_type::move<deci::ast_item_t*>(value_type *this,self_type *that)

{
  ast_item_t **ppaVar1;
  
  ppaVar1 = as<deci::ast_item_t*>(that);
  if (this->yytypeid_ == (type_info *)0x0) {
    this->yytypeid_ = (type_info *)&ast_item_t*::typeinfo;
    *(ast_item_t **)&this->field_0 = *ppaVar1;
    as<deci::ast_item_t*>(that);
    that->yytypeid_ = (type_info *)0x0;
    return;
  }
  __assert_fail("!yytypeid_",
                "/workspace/llm4binary/github/license_c_cmakelists/masscry[P]deci/build_O3/iec61131.y.hpp"
                ,0x102,
                "T &deci::parser_t::value_type::emplace(U &&...) [T = deci::ast_item_t *, U = <deci::ast_item_t *>]"
               );
}

Assistant:

void
    move (self_type&& that)
    {
      emplace<T> (std::move (that.as<T> ()));
      that.destroy<T> ();
    }